

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

unsigned_long hash(XML_Parser parser,KEY s)

{
  long lVar1;
  unsigned_long uVar2;
  size_t sVar3;
  uint64_t uVar4;
  size_t len;
  siphash state;
  siphash local_48;
  
  uVar2 = get_hash_secret_salt(parser);
  local_48.p = local_48.buf;
  local_48.v0 = 0x736f6d6570736575;
  local_48.v1 = uVar2 ^ 0x646f72616e646f6d;
  local_48.v2 = 0x6c7967656e657261;
  local_48.v3 = uVar2 ^ 0x7465646279746573;
  local_48.c = 0;
  if (*s == '\0') {
    len = 0;
  }
  else {
    sVar3 = 0;
    do {
      len = sVar3 + 1;
      lVar1 = sVar3 + 1;
      sVar3 = len;
    } while (s[lVar1] != '\0');
  }
  sip24_update(&local_48,s,len);
  uVar4 = sip24_final(&local_48);
  return uVar4;
}

Assistant:

static unsigned long FASTCALL
hash(XML_Parser parser, KEY s)
{
  struct siphash state;
  struct sipkey key;
  (void)sip24_valid;
  copy_salt_to_sipkey(parser, &key);
  sip24_init(&state, &key);
  sip24_update(&state, s, keylen(s) * sizeof(XML_Char));
  return (unsigned long)sip24_final(&state);
}